

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O3

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::MultiAggregationPS::MultiAggregationPS
          (MultiAggregationPS *this,
          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *lp,SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *simplifier,int _i,int _j,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *constant,shared_ptr<soplex::Tolerances> *tols)

{
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  int iVar1;
  int iVar2;
  fpclass_type fVar3;
  int32_t iVar4;
  element_type *peVar5;
  pointer pnVar6;
  Item *pIVar7;
  bool bVar8;
  long lVar9;
  cpp_dec_float<200U,_int,_void> *pcVar10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar11;
  pointer pnVar12;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar13;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar14;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar15;
  cpp_dec_float<200U,_int,_void> *pcVar16;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  byte bVar17;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4c0;
  cpp_dec_float<200U,_int,_void> local_4b8;
  cpp_dec_float<200U,_int,_void> local_438;
  cpp_dec_float<200U,_int,_void> local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar17 = 0;
  peVar5 = (tols->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_4c0._M_pi =
       (tols->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_4c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_4c0._M_pi)->_M_use_count = (local_4c0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_4c0._M_pi)->_M_use_count = (local_4c0._M_pi)->_M_use_count + 1;
    }
  }
  iVar1 = (lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  iVar2 = (lp->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__PostStep_006a6da8;
  (this->super_PostStep).m_name = "MultiAggregation";
  (this->super_PostStep).nCols = iVar2;
  (this->super_PostStep).nRows = iVar1;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_PostStep)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_4c0);
  if (local_4c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4c0._M_pi);
  }
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__MultiAggregationPS_006a7858;
  this->m_j = _j;
  this->m_i = _i;
  this->m_old_j =
       (lp->
       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).
       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       .set.thenum + -1;
  this->m_old_i =
       (lp->
       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).
       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       .set.thenum + -1;
  pnVar6 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).up.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar12 = pnVar6 + _j;
  pnVar13 = &this->m_upper;
  for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
    (pnVar13->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
    pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar17 * -2 + 1) * 4);
    pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar13 + (ulong)bVar17 * -8 + 4);
  }
  (this->m_upper).m_backend.exp = pnVar6[_j].m_backend.exp;
  (this->m_upper).m_backend.neg = pnVar6[_j].m_backend.neg;
  iVar4 = pnVar6[_j].m_backend.prec_elem;
  (this->m_upper).m_backend.fpclass = pnVar6[_j].m_backend.fpclass;
  (this->m_upper).m_backend.prec_elem = iVar4;
  pnVar6 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).low.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar12 = pnVar6 + _j;
  pnVar13 = &this->m_lower;
  for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
    (pnVar13->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
    pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar17 * -2 + 1) * 4);
    pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar13 + (ulong)bVar17 * -8 + 4);
  }
  (this->m_lower).m_backend.exp = pnVar6[_j].m_backend.exp;
  (this->m_lower).m_backend.neg = pnVar6[_j].m_backend.neg;
  iVar4 = pnVar6[_j].m_backend.prec_elem;
  (this->m_lower).m_backend.fpclass = pnVar6[_j].m_backend.fpclass;
  (this->m_lower).m_backend.prec_elem = iVar4;
  pnVar13 = &this->m_obj;
  if (lp->thesense == MINIMIZE) {
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::obj(pnVar13,lp,_j);
  }
  else {
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::obj((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_4b8,lp,_j);
    pcVar10 = &local_4b8;
    pnVar14 = pnVar13;
    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pnVar14->m_backend).data._M_elems[0] = (pcVar10->data)._M_elems[0];
      pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + ((ulong)bVar17 * -2 + 1) * 4);
      pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar14 + (ulong)bVar17 * -8 + 4);
    }
    (this->m_obj).m_backend.exp = local_4b8.exp;
    (this->m_obj).m_backend.neg = local_4b8.neg;
    (this->m_obj).m_backend.fpclass = local_4b8.fpclass;
    (this->m_obj).m_backend.prec_elem = local_4b8.prec_elem;
    if (local_4b8.fpclass != cpp_dec_float_finite || (this->m_obj).m_backend.data._M_elems[0] != 0)
    {
      (this->m_obj).m_backend.neg = (bool)(local_4b8.neg ^ 1);
    }
  }
  pnVar14 = &this->m_const;
  pnVar11 = constant;
  pnVar15 = pnVar14;
  for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
    (pnVar15->m_backend).data._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
    pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar11 + ((ulong)bVar17 * -2 + 1) * 4);
    pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar15 + (ulong)bVar17 * -8 + 4);
  }
  iVar1 = (constant->m_backend).exp;
  (this->m_const).m_backend.exp = iVar1;
  bVar8 = (constant->m_backend).neg;
  (this->m_const).m_backend.neg = bVar8;
  fVar3 = (constant->m_backend).fpclass;
  (this->m_const).m_backend.fpclass = fVar3;
  iVar4 = (constant->m_backend).prec_elem;
  (this->m_const).m_backend.prec_elem = iVar4;
  pnVar11 = &local_b0;
  for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
    (pnVar11->m_backend).data._M_elems[0] = (constant->m_backend).data._M_elems[0];
    constant = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)constant + ((ulong)bVar17 * -2 + 1) * 4);
    pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar11 + ((ulong)bVar17 * -2 + 1) * 4);
  }
  pnVar6 = (lp->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).left.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar12 = pnVar6 + _i;
  pnVar11 = &local_130;
  local_b0.m_backend.exp = iVar1;
  local_b0.m_backend.neg = bVar8;
  local_b0.m_backend.fpclass = fVar3;
  local_b0.m_backend.prec_elem = iVar4;
  for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
    (pnVar11->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
    pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar17 * -2 + 1) * 4);
    pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar11 + ((ulong)bVar17 * -2 + 1) * 4);
  }
  local_130.m_backend.exp = pnVar6[_i].m_backend.exp;
  local_130.m_backend.neg = pnVar6[_i].m_backend.neg;
  local_130.m_backend.fpclass = pnVar6[_i].m_backend.fpclass;
  local_130.m_backend.prec_elem = pnVar6[_i].m_backend.prec_elem;
  (*(this->super_PostStep)._vptr_PostStep[7])(&local_1b0,this);
  bVar8 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_b0,&local_130,&local_1b0);
  this->m_onLhs = bVar8;
  pnVar6 = (lp->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).left.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar12 = pnVar6 + _i;
  pnVar11 = &local_230;
  for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
    (pnVar11->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
    pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar17 * -2 + 1) * 4);
    pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar11 + ((ulong)bVar17 * -2 + 1) * 4);
  }
  local_230.m_backend.exp = pnVar6[_i].m_backend.exp;
  local_230.m_backend.neg = pnVar6[_i].m_backend.neg;
  local_230.m_backend.fpclass = pnVar6[_i].m_backend.fpclass;
  local_230.m_backend.prec_elem = pnVar6[_i].m_backend.prec_elem;
  pnVar6 = (lp->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).right.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar12 = pnVar6 + _i;
  pnVar11 = &local_2b0;
  for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
    (pnVar11->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
    pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar17 * -2 + 1) * 4);
    pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar11 + ((ulong)bVar17 * -2 + 1) * 4);
  }
  local_2b0.m_backend.exp = pnVar6[_i].m_backend.exp;
  local_2b0.m_backend.neg = pnVar6[_i].m_backend.neg;
  local_2b0.m_backend.fpclass = pnVar6[_i].m_backend.fpclass;
  local_2b0.m_backend.prec_elem = pnVar6[_i].m_backend.prec_elem;
  (*(this->super_PostStep)._vptr_PostStep[7])(&local_330,this);
  bVar8 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_230,&local_2b0,&local_330);
  this->m_eqCons = bVar8;
  pIVar7 = (lp->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.theitem;
  iVar1 = (lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thekey[_i].idx;
  (this->m_row).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_elem = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x0;
  (this->m_row).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memsize = 0;
  (this->m_row).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memused = 0;
  (this->m_row)._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006a69e0;
  (this->m_row).theelem =
       (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::allocMem(&this->m_row,
             pIVar7[iVar1].data.
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .memused);
  this_00 = &(this->m_row).
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator=(this_00,(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)(pIVar7 + iVar1));
  pIVar7 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.theitem;
  iVar1 = (lp->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thekey[_j].idx;
  (this->m_col).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_elem = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x0;
  (this->m_col).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memsize = 0;
  (this->m_col).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memused = 0;
  (this->m_col)._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006a69e0;
  (this->m_col).theelem =
       (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::allocMem(&this->m_col,
             pIVar7[iVar1].data.
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .memused);
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator=(&(this->m_col).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ,(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)(pIVar7 + iVar1));
  local_4b8.fpclass = cpp_dec_float_finite;
  local_4b8.prec_elem = 0x1c;
  local_4b8.data._M_elems[0] = 0;
  local_4b8.data._M_elems[1] = 0;
  local_4b8.data._M_elems[2] = 0;
  local_4b8.data._M_elems[3] = 0;
  local_4b8.data._M_elems[4] = 0;
  local_4b8.data._M_elems[5] = 0;
  local_4b8.data._M_elems[6] = 0;
  local_4b8.data._M_elems[7] = 0;
  local_4b8.data._M_elems[8] = 0;
  local_4b8.data._M_elems[9] = 0;
  local_4b8.data._M_elems[10] = 0;
  local_4b8.data._M_elems[0xb] = 0;
  local_4b8.data._M_elems[0xc] = 0;
  local_4b8.data._M_elems[0xd] = 0;
  local_4b8.data._M_elems[0xe] = 0;
  local_4b8.data._M_elems[0xf] = 0;
  local_4b8.data._M_elems[0x10] = 0;
  local_4b8.data._M_elems[0x11] = 0;
  local_4b8.data._M_elems[0x12] = 0;
  local_4b8.data._M_elems[0x13] = 0;
  local_4b8.data._M_elems[0x14] = 0;
  local_4b8.data._M_elems[0x15] = 0;
  local_4b8.data._M_elems[0x16] = 0;
  local_4b8.data._M_elems[0x17] = 0;
  local_4b8.data._M_elems[0x18] = 0;
  local_4b8.data._M_elems[0x19] = 0;
  local_4b8.data._M_elems._104_5_ = 0;
  local_4b8.data._M_elems[0x1b]._1_3_ = 0;
  local_4b8.exp = 0;
  local_4b8.neg = false;
  pcVar10 = &pnVar13->m_backend;
  if ((&local_4b8 != &pnVar14->m_backend) &&
     (pcVar10 = &pnVar14->m_backend, &local_4b8 != &pnVar13->m_backend)) {
    pcVar16 = &local_4b8;
    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pcVar16->data)._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
      pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar13 + (ulong)bVar17 * -8 + 4);
      pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar17 * -8 + 4);
    }
    local_4b8.exp = (this->m_obj).m_backend.exp;
    local_4b8.neg = (this->m_obj).m_backend.neg;
    local_4b8.fpclass = (this->m_obj).m_backend.fpclass;
    local_4b8.prec_elem = (this->m_obj).m_backend.prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=(&local_4b8,pcVar10);
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_3b0,this_00,this->m_j);
  local_438.fpclass = cpp_dec_float_finite;
  local_438.prec_elem = 0x1c;
  local_438.data._M_elems[0] = 0;
  local_438.data._M_elems[1] = 0;
  local_438.data._M_elems[2] = 0;
  local_438.data._M_elems[3] = 0;
  local_438.data._M_elems[4] = 0;
  local_438.data._M_elems[5] = 0;
  local_438.data._M_elems[6] = 0;
  local_438.data._M_elems[7] = 0;
  local_438.data._M_elems[8] = 0;
  local_438.data._M_elems[9] = 0;
  local_438.data._M_elems[10] = 0;
  local_438.data._M_elems[0xb] = 0;
  local_438.data._M_elems[0xc] = 0;
  local_438.data._M_elems[0xd] = 0;
  local_438.data._M_elems[0xe] = 0;
  local_438.data._M_elems[0xf] = 0;
  local_438.data._M_elems[0x10] = 0;
  local_438.data._M_elems[0x11] = 0;
  local_438.data._M_elems[0x12] = 0;
  local_438.data._M_elems[0x13] = 0;
  local_438.data._M_elems[0x14] = 0;
  local_438.data._M_elems[0x15] = 0;
  local_438.data._M_elems[0x16] = 0;
  local_438.data._M_elems[0x17] = 0;
  local_438.data._M_elems[0x18] = 0;
  local_438.data._M_elems[0x19] = 0;
  local_438.data._M_elems._104_5_ = 0;
  local_438.data._M_elems[0x1b]._1_3_ = 0;
  local_438.exp = 0;
  local_438.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&local_438,&local_4b8,&local_3b0);
  (*(simplifier->
    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    )._vptr_SPxSimplifier[0x11])(simplifier,&local_438);
  return;
}

Assistant:

MultiAggregationPS(const SPxLPBase<R>& lp, SPxMainSM& simplifier, int _i, int _j,
                         R constant, std::shared_ptr<Tolerances> tols)
         : PostStep("MultiAggregation", tols, lp.nRows(), lp.nCols())
         , m_j(_j)
         , m_i(_i)
         , m_old_j(lp.nCols() - 1)
         , m_old_i(lp.nRows() - 1)
         , m_upper(lp.upper(_j))
         , m_lower(lp.lower(_j))
         , m_obj(lp.spxSense() == SPxLPBase<R>::MINIMIZE ? lp.obj(_j) : -lp.obj(_j))
         , m_const(constant)
         , m_onLhs(EQ(constant, lp.lhs(_i), this->epsilon()))
         , m_eqCons(EQ(lp.lhs(_i), lp.rhs(_i), this->epsilon()))
         , m_row(lp.rowVector(_i))
         , m_col(lp.colVector(_j))
      {
         assert(m_row[m_j] != 0.0);
         simplifier.addObjoffset(m_obj * m_const / m_row[m_j]);
      }